

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_define_env.cpp
# Opt level: O0

void skiwi::global_define_environment_allocation
               (Program *prog,environment_map *env,repl_data *data,context *ctxt)

{
  undefined1 local_50 [8];
  global_define_env_visitor gdev;
  context *ctxt_local;
  repl_data *data_local;
  environment_map *env_local;
  Program *prog_local;
  
  gdev.p_ctxt = ctxt;
  if ((prog->alpha_converted & 1U) != 0) {
    anon_unknown_1::global_define_env_visitor::global_define_env_visitor
              ((global_define_env_visitor *)local_50);
    std::shared_ptr<skiwi::environment<skiwi::environment_entry>_>::operator=
              ((shared_ptr<skiwi::environment<skiwi::environment_entry>_> *)&gdev,env);
    gdev.rd = (repl_data *)gdev.p_ctxt;
    gdev.env.
    super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)data;
    visitor<skiwi::Program,_skiwi::(anonymous_namespace)::global_define_env_visitor>::visit
              (prog,(global_define_env_visitor *)local_50);
    prog->global_define_env_allocated = true;
    anon_unknown_1::global_define_env_visitor::~global_define_env_visitor
              ((global_define_env_visitor *)local_50);
    return;
  }
  __assert_fail("prog.alpha_converted",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/global_define_env.cpp"
                ,0x22,
                "void skiwi::global_define_environment_allocation(Program &, environment_map &, repl_data &, context &)"
               );
}

Assistant:

void global_define_environment_allocation(Program& prog, environment_map& env, repl_data& data, context& ctxt)
  {
  assert(prog.alpha_converted);
  global_define_env_visitor gdev;
  gdev.env = env;
  gdev.rd = &data;
  gdev.p_ctxt = &ctxt;
  visitor<Program, global_define_env_visitor>::visit(prog, &gdev);
  prog.global_define_env_allocated = true;
  }